

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall CLPIParser::parseExtensionData(CLPIParser *this,uint8_t *buffer,uint8_t *end)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint dataLength_00;
  ostream *this_00;
  uint32_t dataLength;
  uint32_t dataAddress;
  uint32_t dataID;
  int i;
  int entries;
  BitStreamReader reader;
  uint8_t *end_local;
  uint8_t *buffer_local;
  CLPIParser *this_local;
  
  reader._24_8_ = end;
  BitStreamReader::BitStreamReader((BitStreamReader *)&i);
  BitStreamReader::setBuffer((BitStreamReader *)&i,buffer,(uint8_t *)reader._24_8_);
  uVar1 = BitStreamReader::getBits((BitStreamReader *)&i,0x20);
  if (uVar1 != 0) {
    BitStreamReader::skipBits((BitStreamReader *)&i,0x20);
    BitStreamReader::skipBits((BitStreamReader *)&i,0x18);
    iVar2 = BitStreamReader::getBits<int>((BitStreamReader *)&i,8);
    for (dataAddress = 0; (int)dataAddress < iVar2; dataAddress = dataAddress + 1) {
      uVar1 = BitStreamReader::getBits((BitStreamReader *)&i,0x20);
      uVar3 = BitStreamReader::getBits((BitStreamReader *)&i,0x20);
      dataLength_00 = BitStreamReader::getBits((BitStreamReader *)&i,0x20);
      if (reader.m_curVal - (int)buffer < uVar3 + dataLength_00) {
        this_00 = std::operator<<((ostream *)&std::cerr,"Invalid extended clip info entry skipped.")
        ;
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      else if (uVar1 == 0x10002) {
        HDMV_LPCM_down_mix_coefficient(buffer + uVar3,dataLength_00);
      }
      else if (uVar1 == 0x20004) {
        Extent_Start_Point(this,buffer + uVar3,dataLength_00);
      }
      else if (uVar1 == 0x20005) {
        ProgramInfo_SS(this,buffer + uVar3,dataLength_00);
      }
      else if (uVar1 == 0x20006) {
        CPI_SS(buffer + uVar3,dataLength_00);
      }
    }
  }
  return;
}

Assistant:

void CLPIParser::parseExtensionData(uint8_t* buffer, const uint8_t* end)
{
    // added for 3D compatibility
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    if (reader.getBits(32) == 0)  // length
        return;

    reader.skipBits(32);  // data_block_start_address
    reader.skipBits(24);
    const int entries = reader.getBits<int>(8);
    for (int i = 0; i < entries; ++i)
    {
        const uint32_t dataID = reader.getBits(32);
        const uint32_t dataAddress = reader.getBits(32);
        const uint32_t dataLength = reader.getBits(32);

        if (dataAddress + dataLength > static_cast<uint32_t>(end - buffer))
        {
            LTRACE(LT_WARN, 2, "Invalid extended clip info entry skipped.");
            continue;
        }

        switch (dataID)
        {
        case 0x00010002:
            HDMV_LPCM_down_mix_coefficient(buffer + dataAddress, dataLength);
            break;
        case 0x00020004:
            Extent_Start_Point(buffer + dataAddress, dataLength);
            break;
        case 0x00020005:
            ProgramInfo_SS(buffer + dataAddress, dataLength);
            break;
        case 0x00020006:
            CPI_SS(buffer + dataAddress, dataLength);
            break;
        default:;
        }
    }
}